

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O3

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateCropLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *this_01;
  int iVar2;
  uint uVar3;
  string *psVar4;
  pointer pcVar5;
  uint uVar6;
  uint uVar7;
  bool bVar8;
  iterator iVar9;
  Type *pTVar10;
  mapped_type_conflict1 *pmVar11;
  WeightParams *pWVar12;
  long *plVar13;
  LayerUnion LVar14;
  undefined8 *puVar15;
  uint uVar16;
  ulong *puVar17;
  ulong uVar18;
  undefined8 uVar19;
  _Alloc_hider _Var20;
  uint uVar21;
  _Rb_tree_header *p_Var22;
  string err;
  Result r;
  string err_1;
  undefined1 local_120 [8];
  _Alloc_hider local_118;
  undefined1 local_110 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_f8;
  _Alloc_hider local_f0;
  size_type local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  ulong *local_90;
  long local_88;
  ulong local_80 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  Result::Result((Result *)&local_f8);
  validateInputCount((Result *)local_120,layer,1,2);
  local_f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_120;
  std::__cxx11::string::operator=((string *)&local_f0,(string *)&local_118);
  if (local_118._M_p != local_110 + 8) {
    operator_delete(local_118._M_p,local_110._8_8_ + 1);
  }
  bVar8 = Result::good((Result *)&local_f8);
  if (bVar8) {
    validateOutputCount((Result *)local_120,layer,1,1);
    local_f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_120;
    std::__cxx11::string::operator=((string *)&local_f0,(string *)&local_118);
    if (local_118._M_p != local_110 + 8) {
      operator_delete(local_118._M_p,local_110._8_8_ + 1);
    }
  }
  bVar8 = Result::good((Result *)&local_f8);
  if (!bVar8) goto LAB_00533adc;
  if (this->ndArrayInterpretation != true) goto LAB_00533a2e;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Crop","");
  this_01 = &this->blobNameToRank;
  validateInputOutputRankEquality((Result *)local_120,layer,&local_50,this_01);
  local_f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_120;
  std::__cxx11::string::operator=((string *)&local_f0,(string *)&local_118);
  if (local_118._M_p != local_110 + 8) {
    operator_delete(local_118._M_p,local_110._8_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  bVar8 = Result::good((Result *)&local_f8);
  if (bVar8) {
    paVar1 = &local_b0.field_2;
    local_b0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"Crop","");
    validateRankCount((Result *)local_120,layer,&local_b0,3,-1,this_01);
    local_f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_120;
    std::__cxx11::string::operator=((string *)&local_f0,(string *)&local_118);
    if (local_118._M_p != local_110 + 8) {
      operator_delete(local_118._M_p,local_110._8_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar1) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    bVar8 = Result::good((Result *)&local_f8);
    if (bVar8) {
      if ((layer->input_).super_RepeatedPtrFieldBase.current_size_ < 2) {
LAB_00533a2e:
        if ((layer->input_).super_RepeatedPtrFieldBase.current_size_ == 1) {
          if (layer->_oneof_case_[0] == 0xbe) {
            LVar14 = layer->layer_;
          }
          else {
            LVar14.crop_ = Specification::CropLayerParams::default_instance();
          }
          pWVar12 = (LVar14.batchnorm_)->variance_;
          if (pWVar12 == (WeightParams *)0x0) {
            pWVar12 = (WeightParams *)&Specification::_BorderAmounts_default_instance_;
          }
          if ((((RepeatedPtrField<CoreML::Specification::BorderAmounts_EdgeSizes> *)
               &pWVar12->floatvalue_)->super_RepeatedPtrFieldBase).current_size_ == 2)
          goto LAB_00533adc;
          std::operator+(&local_70,"cropAmounts parameter for the crop layer \'",(layer->name_).ptr_
                        );
          plVar13 = (long *)std::__cxx11::string::append((char *)&local_70);
          paVar1 = &local_d0.field_2;
          puVar17 = (ulong *)(plVar13 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar13 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar17) {
            local_d0.field_2._M_allocated_capacity = *puVar17;
            local_d0.field_2._8_8_ = plVar13[3];
            local_d0._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_d0.field_2._M_allocated_capacity = *puVar17;
            local_d0._M_dataplus._M_p = (pointer)*plVar13;
          }
          local_d0._M_string_length = plVar13[1];
          *plVar13 = (long)puVar17;
          plVar13[1] = 0;
          *(undefined1 *)(plVar13 + 2) = 0;
          if (layer->_oneof_case_[0] == 0xbe) {
            LVar14 = layer->layer_;
          }
          else {
            LVar14.crop_ = Specification::CropLayerParams::default_instance();
          }
          pWVar12 = (LVar14.batchnorm_)->variance_;
          if (pWVar12 == (WeightParams *)0x0) {
            pWVar12 = (WeightParams *)&Specification::_BorderAmounts_default_instance_;
          }
          uVar3 = (((RepeatedPtrField<CoreML::Specification::BorderAmounts_EdgeSizes> *)
                   &pWVar12->floatvalue_)->super_RepeatedPtrFieldBase).current_size_;
          uVar6 = -uVar3;
          if (0 < (int)uVar3) {
            uVar6 = uVar3;
          }
          uVar21 = 1;
          if (9 < uVar6) {
            uVar18 = (ulong)uVar6;
            uVar7 = 4;
            do {
              uVar21 = uVar7;
              uVar16 = (uint)uVar18;
              if (uVar16 < 100) {
                uVar21 = uVar21 - 2;
                goto LAB_00533d1c;
              }
              if (uVar16 < 1000) {
                uVar21 = uVar21 - 1;
                goto LAB_00533d1c;
              }
              if (uVar16 < 10000) goto LAB_00533d1c;
              uVar18 = uVar18 / 10000;
              uVar7 = uVar21 + 4;
            } while (99999 < uVar16);
            uVar21 = uVar21 + 1;
          }
LAB_00533d1c:
          local_90 = local_80;
          std::__cxx11::string::_M_construct
                    ((ulong)&local_90,(char)uVar21 - (char)((int)uVar3 >> 0x1f));
          std::__detail::__to_chars_10_impl<unsigned_int>
                    ((char *)((ulong)(uVar3 >> 0x1f) + (long)local_90),uVar21,uVar6);
          uVar19 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != paVar1) {
            uVar19 = local_d0.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar19 < local_88 + local_d0._M_string_length) {
            uVar18 = 0xf;
            if (local_90 != local_80) {
              uVar18 = local_80[0];
            }
            if (uVar18 < local_88 + local_d0._M_string_length) goto LAB_00533da0;
            puVar15 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)&local_90,0,(char *)0x0,(ulong)local_d0._M_dataplus._M_p);
          }
          else {
LAB_00533da0:
            puVar15 = (undefined8 *)
                      std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_90);
          }
          local_120 = (undefined1  [8])local_110;
          puVar17 = puVar15 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar15 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar17) {
            local_110._0_8_ = *puVar17;
            local_110._8_8_ = puVar15[3];
          }
          else {
            local_110._0_8_ = *puVar17;
            local_120 = (undefined1  [8])*puVar15;
          }
          local_118._M_p = (pointer)puVar15[1];
          *puVar15 = puVar17;
          puVar15[1] = 0;
          *(undefined1 *)puVar17 = 0;
          puVar15 = (undefined8 *)std::__cxx11::string::append(local_120);
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          puVar17 = puVar15 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar15 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar17) {
            local_b0.field_2._M_allocated_capacity = *puVar17;
            local_b0.field_2._8_8_ = puVar15[3];
          }
          else {
            local_b0.field_2._M_allocated_capacity = *puVar17;
            local_b0._M_dataplus._M_p = (pointer)*puVar15;
          }
          local_b0._M_string_length = puVar15[1];
          *puVar15 = puVar17;
          puVar15[1] = 0;
          *(undefined1 *)(puVar15 + 2) = 0;
          if (local_120 != (undefined1  [8])local_110) {
            operator_delete((void *)local_120,local_110._0_8_ + 1);
          }
          if (local_90 != local_80) {
            operator_delete(local_90,local_80[0] + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != paVar1) {
            operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
          }
          Result::Result((Result *)local_120,INVALID_MODEL_PARAMETERS,&local_b0);
        }
        else {
          if (layer->_oneof_case_[0] == 0xbe) {
            LVar14 = layer->layer_;
          }
          else {
            LVar14.crop_ = Specification::CropLayerParams::default_instance();
          }
          if (((LVar14.convolution_)->kernelsize_).current_size_ == 2) goto LAB_00533adc;
          std::operator+(&local_70,"Offset parameter for the crop layer \'",(layer->name_).ptr_);
          plVar13 = (long *)std::__cxx11::string::append((char *)&local_70);
          paVar1 = &local_d0.field_2;
          puVar17 = (ulong *)(plVar13 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar13 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar17) {
            local_d0.field_2._M_allocated_capacity = *puVar17;
            local_d0.field_2._8_8_ = plVar13[3];
            local_d0._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_d0.field_2._M_allocated_capacity = *puVar17;
            local_d0._M_dataplus._M_p = (pointer)*plVar13;
          }
          local_d0._M_string_length = plVar13[1];
          *plVar13 = (long)puVar17;
          plVar13[1] = 0;
          *(undefined1 *)(plVar13 + 2) = 0;
          if (layer->_oneof_case_[0] == 0xbe) {
            LVar14 = layer->layer_;
          }
          else {
            LVar14.crop_ = Specification::CropLayerParams::default_instance();
          }
          uVar3 = ((LVar14.convolution_)->kernelsize_).current_size_;
          uVar6 = -uVar3;
          if (0 < (int)uVar3) {
            uVar6 = uVar3;
          }
          uVar21 = 1;
          if (9 < uVar6) {
            uVar18 = (ulong)uVar6;
            uVar7 = 4;
            do {
              uVar21 = uVar7;
              uVar16 = (uint)uVar18;
              if (uVar16 < 100) {
                uVar21 = uVar21 - 2;
                goto LAB_00533ef2;
              }
              if (uVar16 < 1000) {
                uVar21 = uVar21 - 1;
                goto LAB_00533ef2;
              }
              if (uVar16 < 10000) goto LAB_00533ef2;
              uVar18 = uVar18 / 10000;
              uVar7 = uVar21 + 4;
            } while (99999 < uVar16);
            uVar21 = uVar21 + 1;
          }
LAB_00533ef2:
          local_90 = local_80;
          std::__cxx11::string::_M_construct
                    ((ulong)&local_90,(char)uVar21 - (char)((int)uVar3 >> 0x1f));
          std::__detail::__to_chars_10_impl<unsigned_int>
                    ((char *)((ulong)(uVar3 >> 0x1f) + (long)local_90),uVar21,uVar6);
          uVar19 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != paVar1) {
            uVar19 = local_d0.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar19 < local_88 + local_d0._M_string_length) {
            uVar18 = 0xf;
            if (local_90 != local_80) {
              uVar18 = local_80[0];
            }
            if (uVar18 < local_88 + local_d0._M_string_length) goto LAB_00533f76;
            puVar15 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)&local_90,0,(char *)0x0,(ulong)local_d0._M_dataplus._M_p);
          }
          else {
LAB_00533f76:
            puVar15 = (undefined8 *)
                      std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_90);
          }
          local_120 = (undefined1  [8])local_110;
          puVar17 = puVar15 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar15 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar17) {
            local_110._0_8_ = *puVar17;
            local_110._8_8_ = puVar15[3];
          }
          else {
            local_110._0_8_ = *puVar17;
            local_120 = (undefined1  [8])*puVar15;
          }
          local_118._M_p = (pointer)puVar15[1];
          *puVar15 = puVar17;
          puVar15[1] = 0;
          *(undefined1 *)puVar17 = 0;
          puVar15 = (undefined8 *)std::__cxx11::string::append(local_120);
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          puVar17 = puVar15 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar15 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar17) {
            local_b0.field_2._M_allocated_capacity = *puVar17;
            local_b0.field_2._8_8_ = puVar15[3];
          }
          else {
            local_b0.field_2._M_allocated_capacity = *puVar17;
            local_b0._M_dataplus._M_p = (pointer)*puVar15;
          }
          local_b0._M_string_length = puVar15[1];
          *puVar15 = puVar17;
          puVar15[1] = 0;
          *(undefined1 *)(puVar15 + 2) = 0;
          if (local_120 != (undefined1  [8])local_110) {
            operator_delete((void *)local_120,local_110._0_8_ + 1);
          }
          if (local_90 != local_80) {
            operator_delete(local_90,local_80[0] + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != paVar1) {
            operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
          }
          Result::Result((Result *)local_120,INVALID_MODEL_PARAMETERS,&local_b0);
        }
        local_f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_120;
        std::__cxx11::string::operator=((string *)&local_f0,(string *)&local_118);
        if (local_118._M_p != local_110 + 8) {
          operator_delete(local_118._M_p,local_110._8_8_ + 1);
        }
        *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          **)__return_storage_ptr__ = local_f8;
        paVar1 = &(__return_storage_ptr__->m_message).field_2;
        (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_p == &local_e0) {
          paVar1->_M_allocated_capacity =
               CONCAT71(local_e0._M_allocated_capacity._1_7_,local_e0._M_local_buf[0]);
          *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) = local_e0._8_8_;
        }
        else {
          (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_f0._M_p;
          (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
               CONCAT71(local_e0._M_allocated_capacity._1_7_,local_e0._M_local_buf[0]);
        }
        (__return_storage_ptr__->m_message)._M_string_length = local_e8;
        local_e8 = 0;
        local_e0._M_local_buf[0] = '\0';
        uVar19 = local_b0.field_2._M_allocated_capacity;
        _Var20._M_p = local_b0._M_dataplus._M_p;
        local_f0._M_p = (pointer)&local_e0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p == &local_b0.field_2) goto LAB_00533b2a;
      }
      else {
        iVar9 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                ::find(&this_01->_M_t,
                       (key_type *)((layer->input_).super_RepeatedPtrFieldBase.rep_)->elements[0]);
        p_Var22 = &(this->blobNameToRank)._M_t._M_impl.super__Rb_tree_header;
        if ((_Rb_tree_header *)iVar9._M_node == p_Var22) goto LAB_00533a2e;
        this_00 = &layer->input_;
        pTVar10 = google::protobuf::internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                            (&this_00->super_RepeatedPtrFieldBase,1);
        iVar9 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                ::find(&this_01->_M_t,pTVar10);
        if ((_Rb_tree_header *)iVar9._M_node == p_Var22) goto LAB_00533a2e;
        pTVar10 = google::protobuf::internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                            (&this_00->super_RepeatedPtrFieldBase,0);
        pmVar11 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                  ::at(this_01,pTVar10);
        iVar2 = *pmVar11;
        pTVar10 = google::protobuf::internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                            (&this_00->super_RepeatedPtrFieldBase,1);
        pmVar11 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                  ::at(this_01,pTVar10);
        if (iVar2 == *pmVar11) goto LAB_00533a2e;
        local_118._M_p = (pointer)0x0;
        local_110._0_8_ = local_110._0_8_ & 0xffffffffffffff00;
        psVar4 = (layer->name_).ptr_;
        pcVar5 = (psVar4->_M_dataplus)._M_p;
        local_120 = (undefined1  [8])local_110;
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_70,pcVar5,pcVar5 + psVar4->_M_string_length);
        std::operator+(&local_d0,"Layer \'",&local_70);
        puVar15 = (undefined8 *)std::__cxx11::string::append((char *)&local_d0);
        puVar17 = puVar15 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar15 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar17) {
          local_b0.field_2._M_allocated_capacity = *puVar17;
          local_b0.field_2._8_8_ = puVar15[3];
          local_b0._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_b0.field_2._M_allocated_capacity = *puVar17;
          local_b0._M_dataplus._M_p = (pointer)*puVar15;
        }
        local_b0._M_string_length = puVar15[1];
        *puVar15 = puVar17;
        puVar15[1] = 0;
        *(undefined1 *)(puVar15 + 2) = 0;
        std::__cxx11::string::operator=((string *)local_120,(string *)&local_b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != paVar1) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_120);
        uVar19 = local_110._0_8_;
        _Var20._M_p = (pointer)local_120;
        if (local_120 == (undefined1  [8])local_110) goto LAB_00533b2a;
      }
      operator_delete(_Var20._M_p,uVar19 + 1);
      goto LAB_00533b2a;
    }
  }
LAB_00533adc:
  *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    **)__return_storage_ptr__ = local_f8;
  paVar1 = &(__return_storage_ptr__->m_message).field_2;
  (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_p == &local_e0) {
    paVar1->_M_allocated_capacity =
         CONCAT71(local_e0._M_allocated_capacity._1_7_,local_e0._M_local_buf[0]);
    *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) = local_e0._8_8_;
  }
  else {
    (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_f0._M_p;
    (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
         CONCAT71(local_e0._M_allocated_capacity._1_7_,local_e0._M_local_buf[0]);
  }
  (__return_storage_ptr__->m_message)._M_string_length = local_e8;
  local_e8 = 0;
  local_e0._M_local_buf[0] = '\0';
  local_f0._M_p = (pointer)&local_e0;
LAB_00533b2a:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_p != &local_e0) {
    operator_delete(local_f0._M_p,
                    CONCAT71(local_e0._M_allocated_capacity._1_7_,local_e0._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateCropLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    r = validateInputCount(layer, 1, 2);
    if (r.good()) {
        r = validateOutputCount(layer, 1, 1);
    }

    if (!r.good()){ return r;}
    if (ndArrayInterpretation) {
        r = validateInputOutputRankEquality(layer, "Crop", blobNameToRank);
        if (!r.good()) {return r;}
        r = validateRankCount(layer, "Crop", 3, -1, blobNameToRank);
        if (!r.good()) {return r;}

        if (layer.input_size() > 1) {
            if (blobNameToRank.find(layer.input(0)) != blobNameToRank.end() &&
                blobNameToRank.find(layer.input(1)) != blobNameToRank.end()) {
                if (blobNameToRank.at(layer.input(0)) != blobNameToRank.at(layer.input(1))) {
                    std::string err;
                    err = "Layer '" + std::string(layer.name()) + "' of type 'Crop' expects equal ranks for its inputs, but they are not equal.";
                    return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                }
            }
        }
    }

    if (layer.input_size() == 1) {
        // check the border amounts
        if (layer.crop().cropamounts().borderamounts_size() != 2) {
            std::string err = "cropAmounts parameter for the crop layer '" + layer.name() + "' is of length " + std::to_string(layer.crop().cropamounts().borderamounts_size()) + " but requires exactly two crop constraints (for X,Y axes).";
            r = Result(ResultType::INVALID_MODEL_PARAMETERS, err);
            return r;
        }
    }
    else { // size == 2 checked above
        // offset must be size 2
        if (layer.crop().offset_size() != 2)  {
            std::string err = "Offset parameter for the crop layer '" + layer.name() + "' is of length " + std::to_string(layer.crop().offset_size()) + " but requires exactly two offsets (for X,Y axes).";
            r = Result(ResultType::INVALID_MODEL_PARAMETERS, err);
            return r;
        }
    }

    return r;
}